

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfcc.hpp
# Opt level: O2

Mat_<double> * cvlfilter_zi(Mat_<double> *__return_storage_ptr__,Mat_<double> *b,Mat_<double> *a)

{
  double dVar1;
  int iVar2;
  ostream *poVar3;
  int iVar4;
  _InputArray local_1c8;
  _InputArray local_1b0;
  _OutputArray local_198;
  long *local_180 [44];
  
  if ((*(int *)&b->field_0x8 != 1) || (*(int *)&a->field_0x8 != 1)) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Numerator b and Denominator a must be 1-D.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  dVar1 = **(double **)&a->field_0x10;
  if ((dVar1 != 1.0) || (NAN(dVar1))) {
    cv::operator/((Mat *)local_180,dVar1);
    (**(code **)(*local_180[0] + 0x18))(local_180[0],(Mat *)local_180,b,6);
    cv::MatExpr::~MatExpr((MatExpr *)local_180);
    cv::operator/((Mat *)local_180,**(double **)&a->field_0x10);
    (**(code **)(*local_180[0] + 0x18))(local_180[0],(Mat *)local_180,a,6);
    cv::MatExpr::~MatExpr((MatExpr *)local_180);
  }
  iVar2 = *(int *)&a->field_0x8 * *(int *)&a->field_0xc;
  iVar4 = *(int *)&b->field_0x8 * *(int *)&b->field_0xc;
  if (iVar2 < iVar4) {
    local_1c8.sz.width = 0;
    local_1c8.sz.height = 0;
    local_1c8.flags = -0x7efefffa;
    local_1c8.obj = a;
    cv::Mat_<float>::zeros((int)local_180,1);
    cv::_InputArray::_InputArray(&local_1b0,(MatExpr *)local_180);
    local_198.super__InputArray.sz.width = 0;
    local_198.super__InputArray.sz.height = 0;
    local_198.super__InputArray.flags = -0x7dfefffa;
    local_198.super__InputArray.obj = a;
    cv::hconcat(&local_1c8,&local_1b0,&local_198);
  }
  else {
    if (iVar2 <= iVar4) goto LAB_001053c7;
    local_1c8.sz.width = 0;
    local_1c8.sz.height = 0;
    local_1c8.flags = -0x7efefffa;
    local_1c8.obj = b;
    cv::Mat_<float>::zeros((int)local_180,1);
    cv::_InputArray::_InputArray(&local_1b0,(MatExpr *)local_180);
    local_198.super__InputArray.sz.width = 0;
    local_198.super__InputArray.sz.height = 0;
    local_198.super__InputArray.flags = -0x7dfefffa;
    local_198.super__InputArray.obj = b;
    cv::hconcat(&local_1c8,&local_1b0,&local_198);
  }
  cv::MatExpr::~MatExpr((MatExpr *)local_180);
LAB_001053c7:
  cv::Mat_<double>::Mat_(__return_storage_ptr__,0,0);
  return __return_storage_ptr__;
}

Assistant:

cv::Mat_<double> cvlfilter_zi(cv::Mat_<double> b, cv::Mat_<double> a) {
    if ((b.rows != 1) || (a.rows != 1)) {
        std::cout << "Numerator b and Denominator a must be 1-D." << std::endl;
    }
    if (a(0, 0) != 1) {
        // Normalize the coefficients so a[0] == 1.
        b = b / a(0, 0);
        a = a / a(0, 0);
    }
    int len_a = a.cols * a.rows;
    int len_b = b.cols * b.rows;
    int n = len_a > len_b ? len_a : len_b;
    if (len_a < n) {
        cv::hconcat(a, cv::Mat_<float>::zeros(1, n - len_a), a);
    } else if (len_b < n) {
        cv::hconcat(b, cv::Mat_<float>::zeros(1, n - len_b), b);
    }
    return cv::Mat_<double>(0, 0);
}